

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_HashTable.h
# Opt level: O3

ConstIterator __thiscall
axl::sl::
HashTable<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)(),_axl::sl::HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_axl::sl::EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&,_void_(*)()>
::find(HashTable<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)(),_axl::sl::HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_axl::sl::EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&,_void_(*)()>
       *this,StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *key)

{
  ulong uVar1;
  byte *__s1;
  size_t __n;
  Entry *pEVar2;
  Entry *pEVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  
  uVar1 = (this->m_table).
          super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
          .m_count;
  if (uVar1 != 0) {
    __s1 = (byte *)key->m_p;
    __n = key->m_length;
    if ((long)__n < 1) {
      uVar5 = 0x1505;
    }
    else {
      uVar5 = 0x1505;
      pbVar6 = __s1;
      do {
        uVar5 = (ulong)*pbVar6 + uVar5 * 0x21;
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 < __s1 + __n);
    }
    pEVar2 = (this->m_table).
             super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
             .m_p[uVar5 % uVar1].
             super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>
             .
             super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>
             .m_head;
    pEVar3 = pEVar2;
    while (pEVar3 != (Entry *)0x0) {
      if ((__n == *(size_t *)
                   &((MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
                      *)((long)pEVar2 + 0x20))->super_ListLink) &&
         (iVar4 = bcmp(__s1,*(C **)&((MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
                                      *)((long)pEVar2 + 0x10))->super_ListLink,__n), iVar4 == 0)) {
        return (ConstIterator)pEVar2;
      }
      pEVar3 = (Entry *)((ListLink *)((long)pEVar2 + 0x38))->m_next;
      pEVar2 = (Entry *)&((ListLink *)((long)pEVar3 + -0x40))->m_prev;
    }
  }
  return (ConstIterator)(Entry *)0x0;
}

Assistant:

explicit HashTable(
		const Hash& hash = Hash(),
		const Eq& eq = Eq()
	) {
		m_resizeThreshold = Def_ResizeThreshold;
		m_hash = hash;
		m_eq = eq;
	}